

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

size_t ConcatBailOutKindBits
                 (char *dst,size_t dstSizeBytes,size_t position,uint enumEntryOffsetFromBitsStart)

{
  int iVar1;
  char *format;
  
  format = " | %s";
  if (position == 0) {
    format = "%s";
  }
  iVar1 = sprintf_s(dst + position,dstSizeBytes - position,format,
                    BailOutKindNames[enumEntryOffsetFromBitsStart + 0x28]);
  return (long)iVar1;
}

Assistant:

size_t ConcatBailOutKindBits(_Out_writes_bytes_(dstSizeBytes) char* dst, _In_ size_t dstSizeBytes, _In_ size_t position, _In_ uint enumEntryOffsetFromBitsStart)
{
    const char* kindName = BailOutKindNames[IR::BailOutKindBitsStart + static_cast<IR::BailOutKind>(enumEntryOffsetFromBitsStart)];
    int printedBytes =
        sprintf_s(
            &dst[position],
            dstSizeBytes - position * sizeof(dst[0]),
            position == 0 ? "%s" : " | %s",
            kindName);
    return printedBytes;
}